

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsDemuxer.cpp
# Opt level: O2

bool isM2TSExt(string *streamName)

{
  bool bVar1;
  bool bVar2;
  string sName;
  allocator<char> local_8b;
  allocator<char> local_8a;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  unquoteStr(&local_88,streamName);
  strToLowerCase(&local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,".m2ts",&local_89);
  bVar1 = strEndWith(&local_68,&local_88);
  bVar2 = true;
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,".mts",&local_8a);
    bVar1 = strEndWith(&local_68,&local_28);
    bVar2 = true;
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,".ssif",&local_8b);
      bVar2 = strEndWith(&local_68,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
    std::__cxx11::string::~string((string *)&local_28);
  }
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  return bVar2;
}

Assistant:

bool isM2TSExt(const std::string& streamName)
{
    const string sName = strToLowerCase(unquoteStr(streamName));
    return strEndWith(sName, ".m2ts") || strEndWith(sName, ".mts") || strEndWith(sName, ".ssif");
}